

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.cpp
# Opt level: O3

vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_> *
dg::pta::getBasicBlocksInDominatorOrder
          (vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
           *__return_storage_ptr__,Function *F)

{
  pointer *pppBVar1;
  iterator iVar2;
  long lVar3;
  pointer ppDVar4;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar5;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar6;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar7;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar8;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar9;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar10;
  pointer ppDVar11;
  pointer ppDVar12;
  pointer ppDVar13;
  Function *pFVar14;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  *__range3;
  ulong uVar15;
  size_type __n;
  DomTreeNodeBase<llvm::BasicBlock> **ppDVar16;
  long lVar17;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  to_process;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  new_to_process;
  DomTreeNodeBase<llvm::BasicBlock> *child;
  DomTreeNodeBase<llvm::BasicBlock> *root_node;
  DominatorTreeWrapperPass wrapper;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  local_e8;
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  local_c8;
  DomTreeNodeBase<llvm::BasicBlock> *local_b0;
  BasicBlock *local_a8;
  DomTreeNodeBase<llvm::BasicBlock> *local_a0;
  code *local_98 [4];
  undefined1 *local_78;
  undefined1 local_68 [8];
  void *local_60 [2];
  uint local_50;
  DomTreeNodeBase<llvm::BasicBlock> *local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = 0;
  for (pFVar14 = *(Function **)(F + 0x50); pFVar14 != F + 0x48;
      pFVar14 = *(Function **)(pFVar14 + 8)) {
    __n = __n + 1;
  }
  std::vector<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>::reserve
            (__return_storage_ptr__,__n);
  llvm::DominatorTreeWrapperPass::DominatorTreeWrapperPass((DominatorTreeWrapperPass *)local_98);
  llvm::DominatorTreeWrapperPass::runOnFunction((Function *)local_98);
  local_a0 = local_48;
  local_e8.
  super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)local_48;
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>>::
    _M_realloc_insert<llvm::BasicBlock_const*>
              ((vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>> *)
               __return_storage_ptr__,iVar2,(BasicBlock **)&local_e8);
  }
  else {
    *iVar2._M_current =
         (BasicBlock *)
         local_e8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pppBVar1 = &(__return_storage_ptr__->
                super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  local_e8.
  super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (DomTreeNodeBase<llvm::BasicBlock> **)0x0;
  local_e8.
  super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (DomTreeNodeBase<llvm::BasicBlock> **)0x0;
  local_e8.
  super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (DomTreeNodeBase<llvm::BasicBlock> **)0x0;
  std::
  vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
  ::reserve(&local_e8,4);
  if (local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>*,std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>*>>
    ::_M_realloc_insert<llvm::DomTreeNodeBase<llvm::BasicBlock>*const&>
              ((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>*,std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>*>>
                *)&local_e8,
               (iterator)
               local_e8.
               super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
  }
  else {
    *local_e8.
     super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_48;
    local_e8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  while (local_e8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_e8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    local_c8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (DomTreeNodeBase<llvm::BasicBlock> **)0x0;
    local_c8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (DomTreeNodeBase<llvm::BasicBlock> **)0x0;
    local_c8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (DomTreeNodeBase<llvm::BasicBlock> **)0x0;
    std::
    vector<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ::reserve(&local_c8,
              (long)local_e8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppDVar4 = local_e8.
              super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppDVar16 = local_e8.
               super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppDVar11 = local_e8.
               super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppDVar12 = local_e8.
               super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppDVar13 = local_e8.
               super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_c8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_e8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_c8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_e8.
    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (; local_c8.
           super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = ppDVar13,
        local_c8.
        super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppDVar12,
        local_c8.
        super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = ppDVar11, ppDVar16 != ppDVar4;
        ppDVar16 = ppDVar16 + 1) {
      uVar15 = (ulong)*(uint *)(*ppDVar16 + 0x20);
      ppDVar5 = local_c8.
                super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppDVar6 = local_c8.
                super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppDVar7 = local_c8.
                super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppDVar8 = local_e8.
                super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppDVar9 = local_e8.
                super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppDVar10 = local_e8.
                 super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (uVar15 != 0) {
        lVar3 = *(long *)(*ppDVar16 + 0x18);
        lVar17 = 0;
        local_c8.
        super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e8.
             super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_c8.
        super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e8.
             super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_c8.
        super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e8.
             super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        do {
          local_e8.
          super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppDVar7;
          local_e8.
          super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppDVar6;
          local_e8.
          super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
          ._M_impl.super__Vector_impl_data._M_start = ppDVar5;
          local_b0 = *(DomTreeNodeBase<llvm::BasicBlock> **)(lVar3 + lVar17);
          if (local_c8.
              super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_c8.
              super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<llvm::DomTreeNodeBase<llvm::BasicBlock>*,std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>*>>
            ::_M_realloc_insert<llvm::DomTreeNodeBase<llvm::BasicBlock>*const&>
                      ((vector<llvm::DomTreeNodeBase<llvm::BasicBlock>*,std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>*>>
                        *)&local_c8,
                       (iterator)
                       local_c8.
                       super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_b0);
          }
          else {
            *local_c8.
             super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_b0;
            local_c8.
            super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_c8.
                 super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_a8 = *(BasicBlock **)local_b0;
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>>::
            _M_realloc_insert<llvm::BasicBlock_const*>
                      ((vector<llvm::BasicBlock_const*,std::allocator<llvm::BasicBlock_const*>> *)
                       __return_storage_ptr__,iVar2,&local_a8);
          }
          else {
            *iVar2._M_current = local_a8;
            pppBVar1 = &(__return_storage_ptr__->
                        super__Vector_base<const_llvm::BasicBlock_*,_std::allocator<const_llvm::BasicBlock_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppBVar1 = *pppBVar1 + 1;
          }
          lVar17 = lVar17 + 8;
          ppDVar5 = local_e8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppDVar6 = local_e8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppDVar7 = local_e8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppDVar8 = local_c8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppDVar9 = local_c8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppDVar10 = local_c8.
                     super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        } while (uVar15 << 3 != lVar17);
      }
      local_c8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppDVar10;
      local_c8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppDVar9;
      local_c8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppDVar8;
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppDVar7;
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppDVar6;
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppDVar5;
      ppDVar11 = local_e8.
                 super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppDVar12 = local_e8.
                 super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppDVar13 = local_e8.
                 super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_c8.
           super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_c8.
           super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_c8.
           super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if (local_c8.
        super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (DomTreeNodeBase<llvm::BasicBlock> **)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_e8.
      super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (DomTreeNodeBase<llvm::BasicBlock> **)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::allocator<llvm::DomTreeNodeBase<llvm::BasicBlock>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_98[0] = dg::pta::PointerGraphValidator::reportInvalNode;
  llvm::
  DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
  ::destroyAll((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                *)local_60);
  llvm::deallocate_buffer(local_60[0],(ulong)local_50 << 4,8);
  if (local_78 != local_68) {
    free(local_78);
  }
  llvm::Pass::~Pass((Pass *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::BasicBlock *>
getBasicBlocksInDominatorOrder(llvm::Function &F) {
    std::vector<const llvm::BasicBlock *> blocks;
    blocks.reserve(F.size());

#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 9))
    llvm::DominatorTree DTree;
    DTree.recalculate(F);
#else
    llvm::DominatorTreeWrapperPass wrapper;
    wrapper.runOnFunction(F);
    auto &DTree = wrapper.getDomTree();
#ifndef NDEBUG
    wrapper.verifyAnalysis();
#endif
#endif

    auto *root_node = DTree.getRootNode();
    blocks.push_back(root_node->getBlock());

    std::vector<llvm::DomTreeNode *> to_process;
    to_process.reserve(4);
    to_process.push_back(root_node);

    while (!to_process.empty()) {
        std::vector<llvm::DomTreeNode *> new_to_process;
        new_to_process.reserve(to_process.size());

        for (auto *cur_node : to_process) {
            for (auto *child : *cur_node) {
                new_to_process.push_back(child);
                blocks.push_back(child->getBlock());
            }
        }

        to_process.swap(new_to_process);
    }

    return blocks;
}